

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O2

void __thiscall
draco::Mesh::ApplyPointIdDeduplication
          (Mesh *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
          *id_map,vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                  *unique_point_ids)

{
  pointer pIVar1;
  long lVar2;
  pointer paVar3;
  ulong uVar4;
  long lVar5;
  
  PointCloud::ApplyPointIdDeduplication(&this->super_PointCloud,id_map,unique_point_ids);
  paVar3 = (this->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)paVar3;
  pIVar1 = (id_map->vector_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar4 != (lVar2 / 0xc & 0xffffffffU); uVar4 = uVar4 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      paVar3->_M_elems[lVar5].value_ = pIVar1[paVar3->_M_elems[lVar5].value_].value_;
    }
    paVar3 = paVar3 + 1;
  }
  return;
}

Assistant:

void Mesh::ApplyPointIdDeduplication(
    const IndexTypeVector<PointIndex, PointIndex> &id_map,
    const std::vector<PointIndex> &unique_point_ids) {
  PointCloud::ApplyPointIdDeduplication(id_map, unique_point_ids);
  for (FaceIndex f(0); f < num_faces(); ++f) {
    for (int32_t c = 0; c < 3; ++c) {
      faces_[f][c] = id_map[faces_[f][c]];
    }
  }
}